

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldLiteGenerator::GenerateSerializationCode
          (ImmutableStringFieldLiteGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "if ($is_field_present_message$) {\n  output.writeString($number$, get$capitalized_name$());\n}\n"
                    );
  return;
}

Assistant:

void ImmutableStringFieldLiteGenerator::
GenerateSerializationCode(io::Printer* printer) const {
  // Lite runtime should reduce allocations by serializing the string directly.
  // This avoids spurious intermediary ByteString allocations, cutting overall
  // allocations in half.
  printer->Print(variables_,
    "if ($is_field_present_message$) {\n"
    "  output.writeString($number$, get$capitalized_name$());\n"
    "}\n");
}